

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O0

Vec_Int_t * Sim_UtilCountOnesArray(Vec_Ptr_t *vInfo,int nSimWords)

{
  int iVar1;
  Vec_Int_t *p;
  uint *pSimInfo_00;
  undefined4 local_2c;
  int i;
  uint *pSimInfo;
  Vec_Int_t *vCounters;
  int nSimWords_local;
  Vec_Ptr_t *vInfo_local;
  
  iVar1 = Vec_PtrSize(vInfo);
  p = Vec_IntStart(iVar1);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vInfo), local_2c < iVar1; local_2c = local_2c + 1) {
    pSimInfo_00 = (uint *)Vec_PtrEntry(vInfo,local_2c);
    iVar1 = Sim_UtilCountOnes(pSimInfo_00,nSimWords);
    Vec_IntWriteEntry(p,local_2c,iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Sim_UtilCountOnesArray( Vec_Ptr_t * vInfo, int nSimWords )
{
    Vec_Int_t * vCounters;
    unsigned * pSimInfo;
    int i;
    vCounters = Vec_IntStart( Vec_PtrSize(vInfo) );
    Vec_PtrForEachEntry( unsigned *, vInfo, pSimInfo, i )
        Vec_IntWriteEntry( vCounters, i, Sim_UtilCountOnes(pSimInfo, nSimWords) );
    return vCounters;
}